

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Opnd * __thiscall
Lowerer::GenerateIndirOfOOPData(Lowerer *this,void *address,int32 offset,Instr *instrInsert)

{
  Func *func;
  uint left;
  undefined8 in_RAX;
  StackSym *sym;
  RegOpnd *baseOpnd;
  char16 *desc;
  IndirOpnd *pIVar1;
  int32 local_34 [2];
  int32 dataOffset;
  
  local_34[0] = (int32)((ulong)in_RAX >> 0x20);
  func = instrInsert->m_func;
  left = NativeCodeData::GetDataTotalOffset(address);
  Int32Math::Add(left,offset,local_34);
  sym = Func::GetNativeCodeDataSym(func->topFunc);
  baseOpnd = IR::RegOpnd::New(sym,TyVar,this->m_func);
  desc = NativeCodeData::GetDataDescription(address,func->m_alloc);
  pIVar1 = IR::IndirOpnd::New(baseOpnd,local_34[0],TyUint64,desc,func,true);
  return &pIVar1->super_Opnd;
}

Assistant:

IR::Opnd *
Lowerer::GenerateIndirOfOOPData(void * address, int32 offset, IR::Instr * instrInsert)
{
    Func * func = instrInsert->m_func;
    int32 dataOffset;
    Int32Math::Add(NativeCodeData::GetDataTotalOffset(address), offset, &dataOffset);
    IR::Opnd * opnd = IR::IndirOpnd::New(IR::RegOpnd::New(func->GetTopFunc()->GetNativeCodeDataSym(), TyVar, m_func), dataOffset, TyMachPtr,
#if DBG
                                         NativeCodeData::GetDataDescription(address, func->m_alloc),
#endif
                                         func, true);

    return opnd;
}